

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t canLzip(void)

{
  wchar_t wVar1;
  
  if (canLzip::tested == L'\0') {
    canLzip::tested = L'\x01';
    wVar1 = systemf("lzip --help %s",redirectArgs);
    if (wVar1 == L'\0') {
      canLzip::value = L'\x01';
    }
  }
  return canLzip::value;
}

Assistant:

int
canLzip(void)
{
	static int tested = 0, value = 0;
	if (!tested) {
		tested = 1;
		if (systemf("lzip --help %s", redirectArgs) == 0)
			value = 1;
	}
	return (value);
}